

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O1

void __thiscall baryonyx::pnm_vector::flush(pnm_vector *this)

{
  if (this->m_heigth != 0) {
    std::ostream::write((char *)&this->m_ofs,
                        (long)(this->m_buffer)._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    this->m_heigth = this->m_heigth + -1;
  }
  return;
}

Assistant:

void flush() noexcept
    {
        if (m_heigth == 0)
            return;

        m_ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
        --m_heigth;
    }